

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VLDM_VSTM_sp(DisasContext_conflict1 *s,arg_VLDM_VSTM_sp *a)

{
  int iVar1;
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var2;
  int iVar3;
  TCGv_i32 ret;
  TCGv_i32 arg;
  int local_44;
  int n;
  int i;
  TCGv_i32 tmp;
  TCGv_i32 addr;
  uint32_t offset;
  TCGContext_conflict1 *tcg_ctx;
  arg_VLDM_VSTM_sp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var2 = isar_feature_aa32_fpsp_v2(s->isar);
  if (_Var2) {
    iVar1 = a->imm;
    if ((iVar1 == 0) || (0x20 < a->vd + iVar1)) {
      s_local._7_1_ = false;
    }
    else if ((a->rn == 0xf) && (a->w != 0)) {
      s_local._7_1_ = false;
    }
    else {
      _Var2 = vfp_access_check(s);
      if (_Var2) {
        ret = add_reg_for_lit(s,a->rn,0);
        if (a->p != 0) {
          tcg_gen_addi_i32_aarch64(tcg_ctx_00,ret,ret,a->imm * -4);
        }
        if ((((s->v8m_stackcheck & 1U) != 0) && (a->rn == 0xd)) && (a->w != 0)) {
          gen_helper_v8m_stackcheck(tcg_ctx_00,tcg_ctx_00->cpu_env,ret);
        }
        arg = tcg_temp_new_i32(tcg_ctx_00);
        for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
          if (a->l == 0) {
            neon_load_reg32(tcg_ctx_00,arg,a->vd + local_44);
            iVar3 = get_mem_index(s);
            gen_aa32_st32(s,arg,ret,iVar3);
          }
          else {
            iVar3 = get_mem_index(s);
            gen_aa32_ld32u(s,arg,ret,iVar3);
            neon_store_reg32(tcg_ctx_00,arg,a->vd + local_44);
          }
          tcg_gen_addi_i32_aarch64(tcg_ctx_00,ret,ret,4);
        }
        tcg_temp_free_i32(tcg_ctx_00,arg);
        if (a->w == 0) {
          tcg_temp_free_i32(tcg_ctx_00,ret);
        }
        else {
          if (a->p != 0) {
            tcg_gen_addi_i32_aarch64(tcg_ctx_00,ret,ret,iVar1 * -4);
          }
          store_reg(s,a->rn,ret);
        }
        s_local._7_1_ = true;
      }
      else {
        s_local._7_1_ = true;
      }
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VLDM_VSTM_sp(DisasContext *s, arg_VLDM_VSTM_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t offset;
    TCGv_i32 addr, tmp;
    int i, n;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    n = a->imm;

    if (n == 0 || (a->vd + n) > 32) {
        /*
         * UNPREDICTABLE cases for bad immediates: we choose to
         * UNDEF to avoid generating huge numbers of TCG ops
         */
        return false;
    }
    if (a->rn == 15 && a->w) {
        /* writeback to PC is UNPREDICTABLE, we choose to UNDEF */
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    /* For thumb, use of PC is UNPREDICTABLE.  */
    addr = add_reg_for_lit(s, a->rn, 0);
    if (a->p) {
        /* pre-decrement */
        tcg_gen_addi_i32(tcg_ctx, addr, addr, -(a->imm << 2));
    }

    if (s->v8m_stackcheck && a->rn == 13 && a->w) {
        /*
         * Here 'addr' is the lowest address we will store to,
         * and is either the old SP (if post-increment) or
         * the new SP (if pre-decrement). For post-increment
         * where the old value is below the limit and the new
         * value is above, it is UNKNOWN whether the limit check
         * triggers; we choose to trigger.
         */
        gen_helper_v8m_stackcheck(tcg_ctx, tcg_ctx->cpu_env, addr);
    }

    offset = 4;
    tmp = tcg_temp_new_i32(tcg_ctx);
    for (i = 0; i < n; i++) {
        if (a->l) {
            /* load */
            gen_aa32_ld32u(s, tmp, addr, get_mem_index(s));
            neon_store_reg32(tcg_ctx, tmp, a->vd + i);
        } else {
            /* store */
            neon_load_reg32(tcg_ctx, tmp, a->vd + i);
            gen_aa32_st32(s, tmp, addr, get_mem_index(s));
        }
        tcg_gen_addi_i32(tcg_ctx, addr, addr, offset);
    }
    tcg_temp_free_i32(tcg_ctx, tmp);
    if (a->w) {
        /* writeback */
        if (a->p) {
#ifdef _MSC_VER
            offset = (0 - offset) * n;
#else
            offset = -offset * n;
#endif
            tcg_gen_addi_i32(tcg_ctx, addr, addr, offset);
        }
        store_reg(s, a->rn, addr);
    } else {
        tcg_temp_free_i32(tcg_ctx, addr);
    }

    return true;
}